

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_io.cc
# Opt level: O1

StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> *
draco::ReadPointCloudFromFile
          (StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_>
           *__return_storage_ptr__,string *file_name)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  PointCloud *this;
  byte *pbVar4;
  _Rb_tree_node_base *p_Var5;
  DecoderBuffer decoder_buffer;
  vector<char,_std::allocator<char>_> buffer;
  string extension;
  Decoder decoder;
  undefined1 local_210 [24];
  BitDecoder local_1f8;
  vector<char,_std::allocator<char>_> local_1d8;
  string local_1b8;
  undefined1 local_198 [8];
  undefined8 local_190;
  undefined1 local_188 [16];
  _Base_ptr local_178;
  size_t local_170;
  undefined1 local_168 [32];
  _Rb_tree_node_base local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_118;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_e0;
  BitDecoder local_80 [2];
  StatusOr<std::unique_ptr<draco::PointCloud,_std::default_delete<draco::PointCloud>_>_> local_50;
  
  this = (PointCloud *)operator_new(0xa8);
  PointCloud::PointCloud(this);
  if (file_name->_M_string_length < 4) {
    local_198 = (undefined1  [8])local_188;
    pcVar1 = (file_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_198,pcVar1,pcVar1 + file_name->_M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)local_198,(ulong)file_name);
  }
  parser::ToLower(&local_1b8,(string *)local_198);
  if (local_198 != (undefined1  [8])local_188) {
    operator_delete((void *)local_198,local_188._0_8_ + 1);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_1b8);
  if (iVar3 == 0) {
    ObjDecoder::ObjDecoder((ObjDecoder *)local_198);
    ObjDecoder::DecodeFromFile((Status *)local_210,(ObjDecoder *)local_198,file_name,this);
    if (local_210._0_4_ == OK) {
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->value_)._M_t.
      super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
      super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
      super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl = this;
      this = (PointCloud *)0x0;
    }
    else {
      (__return_storage_ptr__->status_).code_ = local_210._0_4_;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(__return_storage_ptr__->status_).error_msg_,local_210._8_8_,
                 (pointer)(local_210._8_8_ + local_210._16_8_));
      (__return_storage_ptr__->value_)._M_t.
      super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
      super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
      super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl = (PointCloud *)0x0;
    }
    if ((BitDecoder *)local_210._8_8_ != &local_1f8) {
      operator_delete((void *)local_210._8_8_,(ulong)((long)local_1f8.bit_buffer_ + 1));
    }
    DecoderBuffer::BitDecoder::~BitDecoder(local_80);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_e0);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_left != &local_128) {
      operator_delete(local_148._M_left,local_128._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_node_base *)local_168._16_8_ == &local_148) goto LAB_0012362e;
    pbVar4 = (byte *)(local_148._0_8_ + 1);
    p_Var5 = (_Rb_tree_node_base *)local_168._16_8_;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&local_1b8);
    if (iVar3 == 0) {
      PlyDecoder::PlyDecoder((PlyDecoder *)local_198);
      PlyDecoder::DecodeFromFile((Status *)local_210,(PlyDecoder *)local_198,file_name,this);
      if (local_210._0_4_ == OK) {
        if ((BitDecoder *)local_210._8_8_ != &local_1f8) {
          operator_delete((void *)local_210._8_8_,(ulong)((long)local_1f8.bit_buffer_ + 1));
        }
        (__return_storage_ptr__->status_).code_ = OK;
        (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
        (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
        (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->value_)._M_t.
        super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
        super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
        super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl = this;
        this = (PointCloud *)0x0;
      }
      else {
        (__return_storage_ptr__->status_).code_ = local_210._0_4_;
        (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(__return_storage_ptr__->status_).error_msg_,local_210._8_8_,
                   (pointer)(local_210._8_8_ + local_210._16_8_));
        (__return_storage_ptr__->value_)._M_t.
        super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
        super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
        super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl = (PointCloud *)0x0;
        if ((BitDecoder *)local_210._8_8_ != &local_1f8) {
          operator_delete((void *)local_210._8_8_,(ulong)((long)local_1f8.bit_buffer_ + 1));
        }
      }
      DecoderBuffer::BitDecoder::~BitDecoder((BitDecoder *)(local_188 + 8));
      goto LAB_0012362e;
    }
    local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    bVar2 = ReadFileToBuffer(file_name,&local_1d8);
    if (bVar2) {
      DecoderBuffer::DecoderBuffer((DecoderBuffer *)local_210);
      DecoderBuffer::Init((DecoderBuffer *)local_210,
                          local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
      local_188._8_8_ = &local_190;
      local_190 = (undefined1 *)((ulong)local_190._4_4_ << 0x20);
      local_188._0_8_ = 0;
      local_170 = 0;
      local_168._24_8_ = local_168 + 8;
      local_168._8_4_ = _S_red;
      local_168._16_8_ = (_Rb_tree_node_base *)0x0;
      local_148._M_parent = (_Base_ptr)0x0;
      local_178 = (_Base_ptr)local_188._8_8_;
      local_148._0_8_ = local_168._24_8_;
      Decoder::DecodePointCloudFromBuffer(&local_50,(Decoder *)local_198,(DecoderBuffer *)local_210)
      ;
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->value_)._M_t.
      super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
      super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
      super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl =
           (PointCloud *)
           local_50.value_._M_t.
           super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
           super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
           super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl;
      local_50.value_._M_t.
      super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
      super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
      super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl =
           (__uniq_ptr_data<draco::PointCloud,_std::default_delete<draco::PointCloud>,_true,_true>)
           (__uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.status_.error_msg_._M_dataplus._M_p != &local_50.status_.error_msg_.field_2) {
        operator_delete(local_50.status_.error_msg_._M_dataplus._M_p,
                        local_50.status_.error_msg_.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<draco::GeometryAttribute::Type,_std::pair<const_draco::GeometryAttribute::Type,_draco::Options>,_std::_Select1st<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>,_std::less<draco::GeometryAttribute::Type>,_std::allocator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>_>
      ::~_Rb_tree((_Rb_tree<draco::GeometryAttribute::Type,_std::pair<const_draco::GeometryAttribute::Type,_draco::Options>,_std::_Select1st<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>,_std::less<draco::GeometryAttribute::Type>,_std::allocator<std::pair<const_draco::GeometryAttribute::Type,_draco::Options>_>_>
                   *)local_168);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_198);
      DecoderBuffer::BitDecoder::~BitDecoder(&local_1f8);
    }
    else {
      local_210._0_8_ = local_210 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_210,"Unable to read input file.","");
      local_198._0_4_ = 0xffffffff;
      local_190 = local_188 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_210._0_8_,(pointer)(local_210._8_8_ + local_210._0_8_));
      (__return_storage_ptr__->status_).code_ = local_198._0_4_;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(__return_storage_ptr__->status_).error_msg_,local_190,
                 local_190 + local_188._0_8_);
      (__return_storage_ptr__->value_)._M_t.
      super___uniq_ptr_impl<draco::PointCloud,_std::default_delete<draco::PointCloud>_>._M_t.
      super__Tuple_impl<0UL,_draco::PointCloud_*,_std::default_delete<draco::PointCloud>_>.
      super__Head_base<0UL,_draco::PointCloud_*,_false>._M_head_impl = (PointCloud *)0x0;
      if (local_190 != local_188 + 8) {
        operator_delete(local_190,local_188._8_8_ + 1);
      }
      if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
        operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
      }
    }
    if ((_Rb_tree_node_base *)
        local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start == (_Rb_tree_node_base *)0x0) goto LAB_0012362e;
    pbVar4 = (byte *)(local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage +
                     -(long)local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    p_Var5 = (_Rb_tree_node_base *)
             local_1d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  operator_delete(p_Var5,(ulong)pbVar4);
LAB_0012362e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if (this != (PointCloud *)0x0) {
    (*this->_vptr_PointCloud[1])(this);
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::unique_ptr<PointCloud>> ReadPointCloudFromFile(
    const std::string &file_name) {
  std::unique_ptr<PointCloud> pc(new PointCloud());
  // Analyze file extension.
  const std::string extension = parser::ToLower(
      file_name.size() >= 4 ? file_name.substr(file_name.size() - 4)
                            : file_name);
  if (extension == ".obj") {
    // Wavefront OBJ file format.
    ObjDecoder obj_decoder;
    const Status obj_status = obj_decoder.DecodeFromFile(file_name, pc.get());
    if (!obj_status.ok()) {
      return obj_status;
    }
    return std::move(pc);
  }
  if (extension == ".ply") {
    // Wavefront PLY file format.
    PlyDecoder ply_decoder;
    DRACO_RETURN_IF_ERROR(ply_decoder.DecodeFromFile(file_name, pc.get()));
    return std::move(pc);
  }

  std::vector<char> buffer;
  if (!ReadFileToBuffer(file_name, &buffer)) {
    return Status(Status::DRACO_ERROR, "Unable to read input file.");
  }
  DecoderBuffer decoder_buffer;
  decoder_buffer.Init(buffer.data(), buffer.size());
  Decoder decoder;
  auto status_or = decoder.DecodePointCloudFromBuffer(&decoder_buffer);
  return std::move(status_or).value();
}